

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Last.hpp
# Opt level: O1

OUT * __thiscall
linq::Last<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>>,bool,int>>
          (OUT *__return_storage_ptr__,linq *this,
          GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> *source)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  char cVar3;
  out_of_range *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  undefined **ppuVar6;
  undefined1 uVar7;
  undefined **local_50;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined1 local_38;
  
  (*(code *)**(undefined8 **)this)(this);
  cVar3 = (**(code **)(*(long *)this + 8))(this);
  if (cVar3 != '\0') {
    ppuVar6 = (__return_storage_ptr__->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState;
    peVar5 = (__return_storage_ptr__->super_IEnumerable<int_&>).state.
             super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (__return_storage_ptr__->super_IEnumerable<int_&>).state.
             super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    uVar7 = __return_storage_ptr__->Key;
    do {
      (**(code **)(*(long *)this + 0x18))(&local_50,this);
      (**(code **)(*(long *)this + 0x10))(this);
      cVar3 = (**(code **)(*(long *)this + 8))(this);
      p_Var2 = p_Stack_40;
      peVar1 = local_48;
      if (cVar3 == '\0') {
        local_48 = (element_type *)0x0;
        p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ppuVar6 = &PTR_Init_001586d0;
        p_Var4 = p_Var2;
        peVar5 = peVar1;
        uVar7 = local_38;
      }
      local_50 = &PTR_Init_00158638;
      if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
      }
    } while (cVar3 != '\0');
    (__return_storage_ptr__->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
    (__return_storage_ptr__->super_IEnumerable<int_&>).state.
    super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
    __return_storage_ptr__->Key = (bool)uVar7;
    (__return_storage_ptr__->super_IEnumerable<int_&>).super_IState<int_&>._vptr_IState =
         (_func_int **)ppuVar6;
    return __return_storage_ptr__;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"this");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

auto Last(S&& source)
	{
		source.Init();
		if(!source.Valid())
			throw std::out_of_range("this");

		while(true)
		{
			auto result = source.Current();
			source.Advance();

			if(!source.Valid())
				return result;
		}
	}